

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmove_s.c
# Opt level: O0

errno_t memmove_s(void *s1,rsize_t s1max,void *s2,rsize_t n)

{
  char *local_40;
  char *src;
  char *dest;
  rsize_t n_local;
  void *s2_local;
  rsize_t s1max_local;
  void *s1_local;
  
  if ((((s1 == (void *)0x0) || (s2 == (void *)0x0)) || (0x7fffffffffffffff < s1max)) ||
     ((0x7fffffffffffffff < n ||
      (local_40 = (char *)s2, src = (char *)s1, dest = (char *)n, s1max < n)))) {
    if ((s1 != (void *)0x0) && (s1max < 0x8000000000000000)) {
      memset(s1,0,s1max);
    }
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
    s1_local._4_4_ = 0x16;
  }
  else {
    for (; dest != (char *)0x0; dest = dest + -1) {
      if ((src == (char *)s2) || (local_40 == (char *)s1)) {
        local_40 = dest + (long)local_40;
        src = dest + (long)src;
        while (dest != (char *)0x0) {
          src[-1] = local_40[-1];
          local_40 = local_40 + -1;
          src = src + -1;
          dest = dest + -1;
        }
        return 0;
      }
      *src = *local_40;
      local_40 = local_40 + 1;
      src = src + 1;
    }
    s1_local._4_4_ = 0;
  }
  return s1_local._4_4_;
}

Assistant:

errno_t memmove_s( void * s1, rsize_t s1max, const void * s2, rsize_t n )
{
    char * dest = ( char * ) s1;
    const char * src = ( const char * ) s2;

    if ( s1 == NULL || s2 == NULL || s1max > RSIZE_MAX || n > RSIZE_MAX || n > s1max )
    {
        if ( s1 != NULL && s1max <= RSIZE_MAX )
        {
            memset( s1, 0, s1max );
        }

        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return _PDCLIB_EINVAL;
    }

    while ( n )
    {
        if ( dest == s2 || src == s1 )
        {
            src += n;
            dest += n;

            while ( n-- )
            {
                *--dest = *--src;
            }

            return 0;
        }

        *dest++ = *src++;
        --n;
    }

    return 0;
}